

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void pbrt::StatRegisterer::CallCallbacks(StatsAccumulator *accum)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)statFuncs[1];
  for (puVar2 = (undefined8 *)*statFuncs; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*(code *)*puVar2)(accum);
  }
  return;
}

Assistant:

void StatRegisterer::CallCallbacks(StatsAccumulator &accum) {
    for (AccumFunc func : *statFuncs)
        func(accum);
}